

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O3

void __thiscall
CMapLayers::LoadEnvPoints
          (CMapLayers *this,CLayers *pLayers,
          array<CEnvPoint,_allocator_default<CEnvPoint>_> *lEnvPoints)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  int Num;
  int Start;
  int Start_1;
  int local_98;
  int local_94;
  CEnvPoint local_90;
  long local_38;
  long lVar4;
  int *piVar5;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::clear(lEnvPoints);
  (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[6])(pLayers->m_pMap,6,&local_90,&local_94);
  if (local_94 != 0) {
    iVar2 = (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[5])
                      (pLayers->m_pMap,local_90.super_CEnvPoint_v1._0_8_ & 0xffffffff,0,0);
    lVar4 = CONCAT44(extraout_var,iVar2);
    (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[6])
              (pLayers->m_pMap,3,&local_94,&local_98);
    if (0 < local_98) {
      iVar2 = 0;
      do {
        iVar3 = (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[5])
                          (pLayers->m_pMap,(ulong)(uint)(local_94 + iVar2),0,0);
        piVar5 = (int *)CONCAT44(extraout_var_00,iVar3);
        if (*piVar5 < 3) {
          if (0 < piVar5[3]) {
            iVar3 = 0;
            lVar8 = lVar4 + 8;
            do {
              iVar1 = piVar5[2];
              local_90.super_CEnvPoint_v1._0_8_ =
                   *(ulong *)(lVar4 + ((long)iVar3 + (long)iVar1) * 0x18);
              if (0 < piVar5[1]) {
                lVar6 = 0;
                do {
                  local_90.super_CEnvPoint_v1.m_aValues[lVar6] =
                       *(int *)(lVar8 + (long)iVar1 * 0x18 + lVar6 * 4);
                  local_90.m_aInTangentdx[lVar6] = 0;
                  local_90.m_aInTangentdy[lVar6] = 0;
                  local_90.m_aOutTangentdx[lVar6] = 0;
                  local_90.m_aOutTangentdy[lVar6] = 0;
                  lVar6 = lVar6 + 1;
                  iVar7 = piVar5[1];
                  if (3 < iVar7) {
                    iVar7 = 4;
                  }
                } while (lVar6 < iVar7);
              }
              array<CEnvPoint,_allocator_default<CEnvPoint>_>::add(lEnvPoints,&local_90);
              iVar3 = iVar3 + 1;
              lVar8 = lVar8 + 0x18;
            } while (iVar3 < piVar5[3]);
          }
        }
        else if (0 < piVar5[3]) {
          lVar8 = 0;
          do {
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::add
                      (lEnvPoints,(CEnvPoint *)((piVar5[2] + lVar8) * 0x58 + lVar4));
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 < piVar5[3]);
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapLayers::LoadEnvPoints(const CLayers *pLayers, array<CEnvPoint>& lEnvPoints)
{
	lEnvPoints.clear();

	// get envelope points
	CEnvPoint *pPoints = 0x0;
	{
		int Start, Num;
		pLayers->Map()->GetType(MAPITEMTYPE_ENVPOINTS, &Start, &Num);

		if(!Num)
			return;

		pPoints = (CEnvPoint *)pLayers->Map()->GetItem(Start, 0, 0);
	}

	// get envelopes
	int Start, Num;
	pLayers->Map()->GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);
	if(!Num)
		return;


	for(int env = 0; env < Num; env++)
	{
		CMapItemEnvelope *pItem = (CMapItemEnvelope *)pLayers->Map()->GetItem(Start+env, 0, 0);

		if(pItem->m_Version >= 3)
		{
			for(int i = 0; i < pItem->m_NumPoints; i++)
				lEnvPoints.add(pPoints[i + pItem->m_StartPoint]);
		}
		else
		{
			// backwards compatibility
			for(int i = 0; i < pItem->m_NumPoints; i++)
			{
				// convert CEnvPoint_v1 -> CEnvPoint
				CEnvPoint_v1 *pEnvPoint_v1 = &((CEnvPoint_v1 *)pPoints)[i + pItem->m_StartPoint];
				CEnvPoint p;

				p.m_Time = pEnvPoint_v1->m_Time;
				p.m_Curvetype = pEnvPoint_v1->m_Curvetype;

				for(int c = 0; c < minimum(pItem->m_Channels, 4); c++)
				{
					p.m_aValues[c] = pEnvPoint_v1->m_aValues[c];
					p.m_aInTangentdx[c] = 0;
					p.m_aInTangentdy[c] = 0;
					p.m_aOutTangentdx[c] = 0;
					p.m_aOutTangentdy[c] = 0;
				}

				lEnvPoints.add(p);
			}
		}
	}
}